

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O1

int XMLSearch_init_from_XPath(SXML_CHAR *xpath,XMLSearch *search)

{
  char *pcVar1;
  char cVar2;
  SXML_CHAR SVar3;
  SXML_CHAR SVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  XMLSearch *pXVar8;
  SXML_CHAR *attr_value;
  SXML_CHAR *pSVar9;
  SXML_CHAR *pSVar10;
  char *tag;
  SXML_CHAR *pSVar11;
  XMLSearch *pXVar12;
  char *pcVar13;
  int local_60;
  char local_59;
  int r0;
  int l1;
  int is;
  int l0;
  XMLSearch *local_48;
  char *local_40;
  XMLSearch *local_38;
  
  if (search == (XMLSearch *)0x0) {
LAB_0010729c:
    iVar5 = 0;
  }
  else {
    search->tag = (SXML_CHAR *)0x0;
    search->attributes = (XMLAttribute *)0x0;
    search->n_attributes = 0;
    search->text = (SXML_CHAR *)0x0;
    search->next = (_XMLSearch *)0x0;
    search->prev = (_XMLSearch *)0x0;
    search->stop_at = (XMLNode *)0xffffffffffffffff;
    search->init_value = 0x19770522;
    iVar5 = 1;
    if ((xpath != (SXML_CHAR *)0x0) && (*xpath != '\0')) {
      pcVar7 = strdup(xpath);
      if (*pcVar7 != '\0') {
        pXVar8 = search;
        pXVar12 = (XMLSearch *)0x0;
        tag = pcVar7;
        do {
          if ((pXVar8 != search) &&
             (pXVar8 = (XMLSearch *)calloc(1,0x40), pXVar8 == (XMLSearch *)0x0)) {
LAB_0010728a:
            free(pcVar7);
            XMLSearch_free(search,1);
            goto LAB_0010729c;
          }
          for (; *tag == '/'; tag = tag + 1) {
          }
          pcVar13 = tag;
          if (*tag == '\0') {
            free(pcVar7);
            goto LAB_0010729c;
          }
          do {
            while (cVar2 = pcVar13[1], cVar2 != '\\') {
              pcVar13 = pcVar13 + 1;
              if ((cVar2 == '\0') || (cVar2 == '/')) goto LAB_00107000;
            }
            pcVar1 = pcVar13 + 2;
            pcVar13 = pcVar13 + 2;
          } while (*pcVar1 != '\0');
LAB_00107000:
          local_59 = *pcVar13;
          *pcVar13 = '\0';
          pSVar10 = tag;
          if (pXVar8 != (XMLSearch *)0x0) {
            pXVar8->tag = (SXML_CHAR *)0x0;
            pXVar8->attributes = (XMLAttribute *)0x0;
            pXVar8->n_attributes = 0;
            pXVar8->text = (SXML_CHAR *)0x0;
            pXVar8->next = (_XMLSearch *)0x0;
            pXVar8->prev = (_XMLSearch *)0x0;
            pXVar8->stop_at = (XMLNode *)0xffffffffffffffff;
            pXVar8->init_value = 0x19770522;
          }
          for (; (cVar2 = *pSVar10, cVar2 != '\0' && (cVar2 != '[')); pSVar10 = pSVar10 + 1) {
          }
          *pSVar10 = '\0';
          local_48 = pXVar8;
          local_40 = pcVar7;
          local_38 = pXVar12;
          iVar5 = XMLSearch_search_set_tag(pXVar8,tag);
          *pSVar10 = cVar2;
          pcVar7 = local_40;
          if (iVar5 == 0) goto LAB_0010728a;
          if (cVar2 != '\0') {
            while ((pSVar10[1] != '\0' && (pSVar10[1] != ']'))) {
              pSVar9 = pSVar10 + 1;
              for (pSVar11 = pSVar9; cVar2 = *pSVar11, cVar2 != '\0'; pSVar11 = pSVar11 + 1) {
                if ((cVar2 == ',') || (cVar2 == ']')) {
                  *pSVar11 = '\0';
                  break;
                }
              }
              if (*pSVar9 == '@') {
                pSVar9 = pSVar10 + 2;
                iVar5 = split_left_right(pSVar9,'=',&l0,&l1,&is,&r0,&local_60,1,1);
                pcVar7 = local_40;
                if (iVar5 == 0) goto LAB_0010728a;
                SVar3 = pSVar10[(long)l1 + 3];
                SVar4 = pSVar10[(long)local_60 + 3];
                pSVar10[(long)l1 + 3] = '\0';
                pSVar10[(long)local_60 + 3] = '\0';
                attr_value = (SXML_CHAR *)0x0;
                if (-1 < is) {
                  attr_value = pSVar9 + r0;
                }
                uVar6 = XMLSearch_search_add_attribute(local_48,pSVar9 + l0,attr_value,1);
                uVar6 = ~uVar6 >> 0x1f;
                pSVar10[(long)l1 + 3] = SVar3;
                pSVar10[(long)local_60 + 3] = SVar4;
                pSVar9 = pSVar9 + (long)local_60 + -1;
              }
              else {
                uVar6 = 1;
                if (*pSVar9 == '.') {
                  iVar5 = split_left_right(pSVar9,'=',&l0,&l1,&is,&r0,&local_60,1,1);
                  pXVar8 = local_48;
                  pcVar7 = local_40;
                  if (iVar5 == 0) goto LAB_0010728a;
                  SVar3 = pSVar10[(long)local_60 + 2];
                  pSVar10[(long)local_60 + 2] = '\0';
                  if (local_48 == (XMLSearch *)0x0) {
                    uVar6 = 0;
                  }
                  else {
                    pcVar7 = strdup(pSVar9 + r0);
                    pXVar8->text = pcVar7;
                    uVar6 = (uint)(pcVar7 != (char *)0x0);
                  }
                  pSVar10[(long)local_60 + 2] = SVar3;
                  pSVar9 = pSVar9 + (long)local_60 + 1;
                }
              }
              *pSVar11 = cVar2;
              pSVar10 = pSVar9;
              pcVar7 = local_40;
              if (uVar6 == 0) goto LAB_0010728a;
            }
          }
          *pcVar13 = local_59;
          if (local_38 != (XMLSearch *)0x0) {
            local_38->next = local_48;
          }
          if (local_48 != search) {
            local_48->prev = local_38;
          }
          pXVar8 = (XMLSearch *)0x0;
          pcVar7 = local_40;
          pXVar12 = local_48;
          tag = pcVar13;
        } while (*pcVar13 != '\0');
      }
      iVar5 = 1;
      free(pcVar7);
    }
  }
  return iVar5;
}

Assistant:

int XMLSearch_init_from_XPath(const SXML_CHAR* xpath, XMLSearch* search)
{
	XMLSearch *search1, *search2;
	SXML_CHAR *p, *tag, *tag0;
	SXML_CHAR c;

	if (!XMLSearch_init(search))
		return FALSE;

	/* NULL or empty xpath is an empty (initialized only) search */
	if (xpath == NULL || *xpath == NULC)
		return TRUE;

	search1 = NULL;		/* Search struct to add the xpath portion to */
	search2 = search;	/* Search struct to be filled from xpath portion */

	tag = tag0 = sx_strdup(xpath); /* Create a copy of 'xpath' to be able to patch it (or segfault if 'xpath' is const, cnacu6o Sergey@sourceforge!) */
	while (*tag != NULC) {
		if (search2 != search) { /* Allocate a new search when the original one (i.e. 'search') has already been filled */
			search2 = (XMLSearch*)__calloc(1, sizeof(XMLSearch));
			if (search2 == NULL) {
				__free(tag0);
				(void)XMLSearch_free(search, TRUE);
				return FALSE;
			}
		}
		/* Skip all first '/' */
		for (; *tag != NULC && *tag == C2SX('/'); tag++) ;
		if (*tag == NULC) {
			__free(tag0);
			return FALSE;
		}

		/* Look for the end of tag name: after '/' (to get another tag) or end of string */
		for (p = &tag[1]; *p != NULC && *p != C2SX('/'); p++) {
			if (*p == C2SX('\\') && *++p == NULC)
				break; /* Escape character, '\' could be the last character... */
		}
		c = *p; /* Backup character before nulling it */
		*p = NULC;
		if (!_init_search_from_1XPath(tag, search2)) {
			__free(tag0);
			(void)XMLSearch_free(search, TRUE);
			return FALSE;
		}
		*p = c;

		/* 'search2' is the newly parsed tag, 'search1' is the previous tag (or NULL if 'search2' is the first tag to parse (i.e. 'search2' == 'search') */

		if (search1 != NULL) search1->next = search2;
		if (search2 != search) search2->prev = search1;
		search1 = search2;
		search2 = NULL; /* Will force allocation during next loop */
		tag = p;
	}

	__free(tag0);
	return TRUE;
}